

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decrypt.c
# Opt level: O3

int decrypt(EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  uint16_t uVar1;
  gf gVar2;
  ushort uVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  undefined1 auVar8 [16];
  gf g [65];
  gf s_cmp [128];
  gf s [128];
  gf locator [65];
  uchar r [436];
  gf images [3488];
  gf local_2048 [64];
  undefined2 local_1fc8;
  gf local_1fb8 [128];
  gf local_1eb8 [128];
  gf local_1db8 [72];
  uchar local_1d28 [96];
  undefined1 local_1cc8 [352];
  gf local_1b68 [3488];
  
  memcpy(local_1d28,outlen,0x60);
  lVar4 = 0;
  memset(local_1cc8,0,0x154);
  do {
    uVar1 = load2(out + lVar4);
    *(uint16_t *)((long)local_2048 + lVar4) = uVar1 & 0xfff;
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x80);
  local_1fc8 = 1;
  synd(local_1eb8,local_2048,(gf *)in,local_1d28);
  bm(local_1db8,local_1eb8);
  root(local_1b68,local_1db8,(gf *)in);
  uVar5 = 0;
  memset(ctx,0,0x1b4);
  uVar3 = 0;
  do {
    gVar2 = gf_iszero(local_1b68[uVar5]);
    ctx[uVar5 >> 3 & 0x1fffffff] =
         (EVP_PKEY_CTX)((byte)ctx[uVar5 >> 3 & 0x1fffffff] | (char)(gVar2 & 1) << ((byte)uVar5 & 7))
    ;
    uVar3 = uVar3 + (gVar2 & 1);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0xda0);
  synd(local_1fb8,local_2048,(gf *)in,(uchar *)ctx);
  auVar6 = ZEXT216(uVar3 ^ 0x40);
  lVar4 = 0;
  do {
    auVar6 = auVar6 | *(undefined1 (*) [16])(local_1fb8 + lVar4) ^
                      *(undefined1 (*) [16])(local_1eb8 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x80);
  auVar8._0_8_ = auVar6._8_8_;
  auVar8._8_4_ = auVar6._8_4_;
  auVar8._12_4_ = auVar6._12_4_;
  uVar7 = SUB164(auVar8 | auVar6,4) | SUB164(auVar8 | auVar6,0);
  return (-(uVar7 >> 0x10 | uVar7) & 0xffff) >> 0xf;
}

Assistant:

int decrypt(unsigned char *e, const unsigned char *sk, const unsigned char *c, gf *L)
{
  int i, w = 0;
  uint16_t check;

  unsigned char r[ SYS_N/8 ];

  gf g[ SYS_T+1 ];
//  gf L[ SYS_N ];

  gf s[ SYS_T*2 ];
  gf s_cmp[ SYS_T*2 ];
  gf locator[ SYS_T+1 ];
  gf images[ SYS_N ];

  gf t;

  //

  for (i = 0; i < SYND_BYTES; i++)       r[i] = c[i];
  for (i = SYND_BYTES; i < SYS_N/8; i++) r[i] = 0;

  for (i = 0; i < SYS_T; i++) { g[i] = load2(sk); g[i] &= GFMASK; sk += 2; } g[ SYS_T ] = 1;

  //support_gen(L, sk);

  synd(s, g, L, r);

  bm(locator, s);

  root(images, locator, L);

  //

  for (i = 0; i < SYS_N/8; i++)
    e[i] = 0;

  for (i = 0; i < SYS_N; i++)
  {
    t = gf_iszero(images[i]) & 1;

    e[ i/8 ] |= t << (i%8);
    w += t;

  }

#ifdef KAT
  {
    int k;
    printf("decrypt e: positions");
    for (k = 0;k < SYS_N;++k)
      if (e[k/8] & (1 << (k&7)))
        printf(" %d",k);
    printf("\n");
  }
#endif

  synd(s_cmp, g, L, e);

  //

  check = w;
  check ^= SYS_T;

  for (i = 0; i < SYS_T*2; i++)
    check |= s[i] ^ s_cmp[i];

  check -= 1;
  check >>= 15;

  return check ^ 1;
}